

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible_match_test.cc
# Opt level: O1

void re2::PossibleMatchRangeHandWritten(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Regexp *this;
  Prog *this_00;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *src;
  undefined8 *puVar5;
  long lVar6;
  int iVar7;
  string max;
  string min;
  string local_228;
  string local_208;
  long local_1e8;
  string local_1e0;
  char *local_1c0;
  undefined4 local_1b8;
  LogMessage local_1b0;
  
  lVar6 = 0;
  do {
    puVar5 = &tests + lVar6 * 4;
    iVar7 = 1;
    local_1e8 = lVar6;
    do {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      if (iVar7 == 1) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x6e,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),"Checking regexp=",0x10);
        pcVar1 = (char *)*puVar5;
        local_1c0 = pcVar1;
        if (pcVar1 == (char *)0x0) {
          local_1b8 = 0;
          src = extraout_RDX;
        }
        else {
          sVar4 = strlen(pcVar1);
          local_1b8 = (undefined4)sVar4;
          src = extraout_RDX_00;
        }
        CEscape_abi_cxx11_(&local_1e0,(re2 *)&local_1c0,src);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),local_1e0._M_dataplus._M_p,
                   local_1e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        LogMessage::~LogMessage(&local_1b0);
        local_1b0._0_8_ = pcVar1;
        if (pcVar1 == (char *)0x0) {
          local_1b0._8_4_ = 0;
        }
        else {
          sVar4 = strlen(pcVar1);
          local_1b0._8_4_ = SUB84(sVar4,0);
        }
        this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
        if (this == (Regexp *)0x0) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x70,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8),"Check failed: re",0x10);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        this_00 = Regexp::CompileToProg(this,0);
        if (this_00 == (Prog *)0x0) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x72,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8),"Check failed: prog",0x12);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        bVar2 = Prog::PossibleMatchRange(this_00,&local_208,&local_228,(&DAT_0014da68)[lVar6 * 8]);
        if (!bVar2) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x73,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8U),
                     "Check failed: prog->PossibleMatchRange(&min, &max, t.maxlen)",0x3c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8U)," ",1);
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)&local_1b0 + 8 +
                            (int)*(undefined8 *)(CONCAT44(local_1b0._12_4_,local_1b0._8_4_) + -0x18)
                           );
          }
          else {
            sVar4 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)&local_1b0 + 8),pcVar1,sVar4);
          }
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        Prog::~Prog(this_00);
        operator_delete(this_00);
        Regexp::Decref(this);
      }
      else {
        RE2::RE2((RE2 *)&local_1b0,(char *)*puVar5);
        bVar2 = RE2::PossibleMatchRange
                          ((RE2 *)&local_1b0,&local_208,&local_228,(&DAT_0014da68)[lVar6 * 8]);
        RE2::~RE2((RE2 *)&local_1b0);
        if (!bVar2) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x78,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8),
                     "Check failed: RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen)",0x44);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_208);
      if (iVar3 != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7a,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),"Check failed: (t.min) == (min)",0x1e);
        pcVar1 = (char *)*puVar5;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_1b0 + 8 +
                          (int)*(undefined8 *)(CONCAT44(local_1b0._12_4_,local_1b0._8_4_) + -0x18));
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8),pcVar1,sVar4);
        }
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar3 != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7b,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),"Check failed: (t.max) == (max)",0x1e);
        pcVar1 = (char *)*puVar5;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_1b0 + 8 +
                          (int)*(undefined8 *)(CONCAT44(local_1b0._12_4_,local_1b0._8_4_) + -0x18));
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)&local_1b0 + 8),pcVar1,sVar4);
        }
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      iVar7 = iVar7 + -1;
    } while (iVar7 == 0);
    lVar6 = local_1e8 + 1;
  } while (lVar6 != 0x43);
  return;
}

Assistant:

TEST(PossibleMatchRange, HandWritten) {
  for (int i = 0; i < arraysize(tests); i++) {
    for (int j = 0; j < 2; j++) {
      const PrefixTest& t = tests[i];
      string min, max;
      if (j == 0) {
        LOG(INFO) << "Checking regexp=" << CEscape(t.regexp);
        Regexp* re = Regexp::Parse(t.regexp, Regexp::LikePerl, NULL);
        CHECK(re);
        Prog* prog = re->CompileToProg(0);
        CHECK(prog);
        CHECK(prog->PossibleMatchRange(&min, &max, t.maxlen))
          << " " << t.regexp;
        delete prog;
        re->Decref();
      } else {
        CHECK(RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen));
      }
      EXPECT_EQ(t.min, min) << t.regexp;
      EXPECT_EQ(t.max, max) << t.regexp;
    }
  }
}